

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglfunctions.cpp
# Opt level: O1

int qt_gl_resolve_features(void)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  OpenGLContextProfile OVar4;
  QOpenGLContext *this;
  Node<QByteArray,_QHashDummyValue> *pNVar5;
  pair<int,_int> pVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  long in_FS_OFFSET;
  bool bVar11;
  QSurfaceFormat format;
  QOpenGLExtensionMatcher extensions;
  QByteArray local_c0;
  undefined1 local_a8 [8];
  QByteArray local_a0;
  QByteArray local_88;
  QByteArray local_70;
  QByteArray local_58;
  Hash local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this = QOpenGLContext::currentContext();
  local_40.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  QOpenGLExtensionMatcher::QOpenGLExtensionMatcher((QOpenGLExtensionMatcher *)&local_40);
  QByteArray::QByteArray(&local_58,"GL_KHR_blend_equation_advanced",-1);
  if (local_40.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
    bVar11 = false;
  }
  else {
    pNVar5 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
             findNode<QByteArray>(local_40.d,&local_58);
    bVar11 = pNVar5 != (Node<QByteArray,_QHashDummyValue> *)0x0;
  }
  if (bVar11) {
LAB_00568cfd:
    bVar2 = (bool)(bVar11 ^ 1);
    QByteArray::QByteArray(&local_88,"GL_KHR_blend_equation_advanced_coherent",-1);
    if ((local_40.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) ||
       (pNVar5 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
                 findNode<QByteArray>(local_40.d,&local_88),
       pNVar5 == (Node<QByteArray,_QHashDummyValue> *)0x0)) {
      QByteArray::QByteArray(&local_a0,"GL_NV_blend_equation_advanced_coherent",-1);
      bVar1 = true;
      if (local_40.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
        uVar10 = 0;
      }
      else {
        pNVar5 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
                 findNode<QByteArray>(local_40.d,&local_a0);
        uVar10 = (uint)(pNVar5 != (Node<QByteArray,_QHashDummyValue> *)0x0) << 0x11;
      }
      bVar11 = true;
    }
    else {
      uVar10 = 0x20000;
      bVar1 = true;
      bVar11 = false;
    }
  }
  else {
    QByteArray::QByteArray(&local_70,"GL_NV_blend_equation_advanced",-1);
    bVar2 = true;
    if ((local_40.d != (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) &&
       (pNVar5 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
                 findNode<QByteArray>(local_40.d,&local_70),
       pNVar5 != (Node<QByteArray,_QHashDummyValue> *)0x0)) goto LAB_00568cfd;
    bVar1 = false;
    bVar11 = false;
    uVar10 = 0;
  }
  if ((bVar11) && (&(local_a0.d.d)->super_QArrayData != (QArrayData *)0x0)) {
    LOCK();
    ((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_a0.d.d)->super_QArrayData,1,0x10);
    }
  }
  if ((bVar1) && (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0)) {
    LOCK();
    ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,1,0x10);
    }
  }
  if ((bVar2) && (&(local_70.d.d)->super_QArrayData != (QArrayData *)0x0)) {
    LOCK();
    ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_70.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,1,0x10);
    }
  }
  bVar11 = QOpenGLContext::isOpenGLES(this);
  if (bVar11) {
    QByteArray::QByteArray(&local_58,"GL_IMG_texture_npot",-1);
    if (local_40.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
      uVar8 = 0xfff;
    }
    else {
      pNVar5 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
               findNode<QByteArray>(local_40.d,&local_58);
      uVar8 = (uint)(pNVar5 != (Node<QByteArray,_QHashDummyValue> *)0x0) << 0xc | 0xfff;
    }
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,1,0x10);
      }
    }
    QByteArray::QByteArray(&local_58,"GL_OES_texture_npot",-1);
    if (local_40.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
      bVar11 = false;
    }
    else {
      pNVar5 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
               findNode<QByteArray>(local_40.d,&local_58);
      bVar11 = pNVar5 != (Node<QByteArray,_QHashDummyValue> *)0x0;
    }
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,1,0x10);
      }
    }
    if (bVar11) {
      uVar8 = 0x3fff;
    }
    QOpenGLContext::format((QOpenGLContext *)&local_c0);
    iVar3 = QSurfaceFormat::majorVersion((QSurfaceFormat *)&local_c0);
    bVar11 = true;
    if (iVar3 < 3) {
      QByteArray::QByteArray(&local_58,"GL_EXT_texture_rg",-1);
      if (local_40.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
        bVar11 = false;
      }
      else {
        pNVar5 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
                 findNode<QByteArray>(local_40.d,&local_58);
        bVar11 = pNVar5 != (Node<QByteArray,_QHashDummyValue> *)0x0;
      }
    }
    if ((iVar3 < 3) && (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0)) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,1,0x10);
      }
    }
    QSurfaceFormat::~QSurfaceFormat((QSurfaceFormat *)&local_c0);
    uVar7 = uVar8 | uVar10 | 0x8000;
    if (!bVar11) {
      uVar7 = uVar8 | uVar10;
    }
    QOpenGLContext::format((QOpenGLContext *)&local_c0);
    iVar3 = QSurfaceFormat::majorVersion((QSurfaceFormat *)&local_c0);
    QSurfaceFormat::~QSurfaceFormat((QSurfaceFormat *)&local_c0);
    if (2 < iVar3) {
      QOpenGLContext::format((QOpenGLContext *)local_a8);
      iVar3 = QSurfaceFormat::minorVersion((QSurfaceFormat *)local_a8);
      uVar10 = 0x10000;
      if ((1 < iVar3) &&
         (QByteArray::QByteArray(&local_c0,"GL_KHR_blend_equation_advanced_coherent",-1),
         local_40.d != (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0)) {
        pNVar5 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
                 findNode<QByteArray>(local_40.d,&local_c0);
        uVar10 = (uint)(pNVar5 != (Node<QByteArray,_QHashDummyValue> *)0x0) << 0x11 | 0x10000;
      }
      if ((1 < iVar3) && (&(local_c0.d.d)->super_QArrayData != (QArrayData *)0x0)) {
        LOCK();
        ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_c0.d.d)->super_QArrayData,1,0x10);
        }
      }
      QSurfaceFormat::~QSurfaceFormat((QSurfaceFormat *)local_a8);
      uVar7 = uVar7 | uVar10;
    }
    goto LAB_005695f0;
  }
  local_a8 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
  QOpenGLContext::currentContext();
  QOpenGLContext::format((QOpenGLContext *)local_a8);
  iVar3 = QSurfaceFormat::majorVersion((QSurfaceFormat *)local_a8);
  if (iVar3 < 3) {
    QByteArray::QByteArray(&local_58,"GL_EXT_framebuffer_object",-1);
    if (local_40.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
      bVar11 = false;
    }
    else {
      pNVar5 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
               findNode<QByteArray>(local_40.d,&local_58);
      bVar11 = pNVar5 != (Node<QByteArray,_QHashDummyValue> *)0x0;
    }
    uVar8 = 0x18008;
    if (!bVar11) {
      QByteArray::QByteArray(&local_c0,"GL_ARB_framebuffer_object",-1);
      if (local_40.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
        uVar8 = 0x8000;
      }
      else {
        pNVar5 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
                 findNode<QByteArray>(local_40.d,&local_c0);
        uVar8 = 0x18008;
        if (pNVar5 == (Node<QByteArray,_QHashDummyValue> *)0x0) {
          uVar8 = 0x8000;
        }
      }
    }
    if ((!bVar11) && (&(local_c0.d.d)->super_QArrayData != (QArrayData *)0x0)) {
      LOCK();
      ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_c0.d.d)->super_QArrayData,1,0x10);
      }
    }
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,1,0x10);
      }
    }
    uVar10 = uVar8 | uVar10;
  }
  else {
    uVar10 = uVar10 | 0x18008;
  }
  iVar3 = QSurfaceFormat::majorVersion((QSurfaceFormat *)local_a8);
  if (iVar3 < 2) {
    QByteArray::QByteArray(&local_58,"GL_ARB_multitexture",-1);
    if (local_40.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
      uVar8 = 0;
    }
    else {
      pNVar5 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
               findNode<QByteArray>(local_40.d,&local_58);
      uVar8 = (uint)(pNVar5 != (Node<QByteArray,_QHashDummyValue> *)0x0);
    }
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,1,0x10);
      }
    }
    QByteArray::QByteArray(&local_58,"GL_ARB_shader_objects",-1);
    if (local_40.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
      bVar11 = false;
    }
    else {
      pNVar5 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
               findNode<QByteArray>(local_40.d,&local_58);
      bVar11 = pNVar5 != (Node<QByteArray,_QHashDummyValue> *)0x0;
    }
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,1,0x10);
      }
    }
    uVar7 = uVar8 | uVar10 | 2;
    if (!bVar11) {
      uVar7 = uVar8 | uVar10;
    }
    QByteArray::QByteArray(&local_58,"GL_EXT_blend_color",-1);
    if (local_40.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
      bVar11 = false;
    }
    else {
      pNVar5 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
               findNode<QByteArray>(local_40.d,&local_58);
      bVar11 = pNVar5 != (Node<QByteArray,_QHashDummyValue> *)0x0;
    }
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,1,0x10);
      }
    }
    uVar10 = uVar7 | 0x10;
    if (!bVar11) {
      uVar10 = uVar7;
    }
    QByteArray::QByteArray(&local_58,"GL_EXT_blend_equation_separate",-1);
    if (local_40.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
      bVar11 = false;
    }
    else {
      pNVar5 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
               findNode<QByteArray>(local_40.d,&local_58);
      bVar11 = pNVar5 != (Node<QByteArray,_QHashDummyValue> *)0x0;
    }
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,1,0x10);
      }
    }
    uVar8 = uVar10 | 0x40;
    if (!bVar11) {
      uVar8 = uVar10;
    }
    QByteArray::QByteArray(&local_58,"GL_EXT_blend_subtract",-1);
    if (local_40.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
      bVar11 = false;
    }
    else {
      pNVar5 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
               findNode<QByteArray>(local_40.d,&local_58);
      bVar11 = pNVar5 != (Node<QByteArray,_QHashDummyValue> *)0x0;
    }
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,1,0x10);
      }
    }
    uVar10 = uVar8 | 0x100;
    if (!bVar11) {
      uVar10 = uVar8;
    }
    QByteArray::QByteArray(&local_58,"GL_EXT_blend_func_separate",-1);
    if (local_40.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
      bVar11 = false;
    }
    else {
      pNVar5 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
               findNode<QByteArray>(local_40.d,&local_58);
      bVar11 = pNVar5 != (Node<QByteArray,_QHashDummyValue> *)0x0;
    }
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,1,0x10);
      }
    }
    uVar8 = uVar10 | 0x80;
    if (!bVar11) {
      uVar8 = uVar10;
    }
    QByteArray::QByteArray(&local_58,"GL_ARB_texture_compression",-1);
    if (local_40.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
      bVar11 = false;
    }
    else {
      pNVar5 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
               findNode<QByteArray>(local_40.d,&local_58);
      bVar11 = pNVar5 != (Node<QByteArray,_QHashDummyValue> *)0x0;
    }
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,1,0x10);
      }
    }
    uVar10 = uVar8 | 0x200;
    if (!bVar11) {
      uVar10 = uVar8;
    }
    QByteArray::QByteArray(&local_58,"GL_ARB_multisample",-1);
    if (local_40.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
      bVar11 = false;
    }
    else {
      pNVar5 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
               findNode<QByteArray>(local_40.d,&local_58);
      bVar11 = pNVar5 != (Node<QByteArray,_QHashDummyValue> *)0x0;
    }
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,1,0x10);
      }
    }
    uVar8 = uVar10 | 0x400;
    if (!bVar11) {
      uVar8 = uVar10;
    }
    QByteArray::QByteArray(&local_58,"GL_ARB_texture_non_power_of_two",-1);
    if (local_40.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
      bVar11 = false;
    }
    else {
      pNVar5 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
               findNode<QByteArray>(local_40.d,&local_58);
      bVar11 = pNVar5 != (Node<QByteArray,_QHashDummyValue> *)0x0;
    }
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,1,0x10);
      }
    }
    uVar10 = uVar8 | 0x3000;
    if (!bVar11) {
      uVar10 = uVar8;
    }
  }
  else {
    uVar10 = uVar10 | 0x3ff7;
  }
  pVar6 = QSurfaceFormat::version((QSurfaceFormat *)local_a8);
  bVar11 = true;
  iVar3 = pVar6.first;
  if (((iVar3 < 3) || ((long)pVar6 < 0 && iVar3 == 3)) ||
     (((ulong)pVar6 >> 0x20 == 0 && iVar3 == 3 &&
      (bVar2 = QSurfaceFormat::testOption((QSurfaceFormat *)local_a8,DeprecatedFunctions), bVar2))))
  {
    bVar2 = false;
  }
  else {
    iVar9 = pVar6.second;
    bVar2 = iVar9 == 1 && iVar3 == 3;
    if ((iVar9 == 1 && iVar3 == 3) &&
       (QByteArray::QByteArray(&local_58,"GL_ARB_compatibility",-1),
       local_40.d != (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0)) {
      pNVar5 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
               findNode<QByteArray>(local_40.d,&local_58);
      bVar11 = pNVar5 != (Node<QByteArray,_QHashDummyValue> *)0x0;
      if (iVar3 < 3 || bVar11) {
        bVar2 = bVar2 || bVar11;
      }
      else {
LAB_005696b5:
        if (iVar9 < 2 && iVar3 == 3) goto LAB_005696df;
        OVar4 = QSurfaceFormat::profile((QSurfaceFormat *)local_a8);
        bVar11 = OVar4 == CompatibilityProfile;
      }
    }
    else {
      if (2 < iVar3) goto LAB_005696b5;
LAB_005696df:
      bVar11 = false;
    }
  }
  if ((bVar2) && (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0)) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,1,0x10);
    }
  }
  uVar7 = uVar10 | 0x4000;
  if (!bVar11) {
    uVar7 = uVar10;
  }
  QSurfaceFormat::~QSurfaceFormat((QSurfaceFormat *)local_a8);
LAB_005695f0:
  QHash<QByteArray,_QHashDummyValue>::~QHash(&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return uVar7;
}

Assistant:

static int qt_gl_resolve_features()
{
    QOpenGLContext *ctx = QOpenGLContext::currentContext();
    QOpenGLExtensionMatcher extensions;
    int features = 0;
    if ((extensions.match("GL_KHR_blend_equation_advanced")
        || extensions.match("GL_NV_blend_equation_advanced")) &&
        (extensions.match("GL_KHR_blend_equation_advanced_coherent")
        || extensions.match("GL_NV_blend_equation_advanced_coherent"))) {
        // We need both the advanced equations and the coherency for us
        // to be able to easily use the new blend equations
        features |= QOpenGLFunctions::BlendEquationAdvanced;
    }
    if (ctx->isOpenGLES()) {
        // OpenGL ES
        features |= QOpenGLFunctions::Multitexture |
            QOpenGLFunctions::Shaders |
            QOpenGLFunctions::Buffers |
            QOpenGLFunctions::Framebuffers |
            QOpenGLFunctions::BlendColor |
            QOpenGLFunctions::BlendEquation |
            QOpenGLFunctions::BlendEquationSeparate |
            QOpenGLFunctions::BlendFuncSeparate |
            QOpenGLFunctions::BlendSubtract |
            QOpenGLFunctions::CompressedTextures |
            QOpenGLFunctions::Multisample |
            QOpenGLFunctions::StencilSeparate;
        if (extensions.match("GL_IMG_texture_npot"))
            features |= QOpenGLFunctions::NPOTTextures;
        if (extensions.match("GL_OES_texture_npot"))
            features |= QOpenGLFunctions::NPOTTextures |
                QOpenGLFunctions::NPOTTextureRepeat;
        if (ctx->format().majorVersion() >= 3 || extensions.match("GL_EXT_texture_rg"))
            features |= QOpenGLFunctions::TextureRGFormats;
        if (ctx->format().majorVersion() >= 3) {
            features |= QOpenGLFunctions::MultipleRenderTargets;
            if (ctx->format().minorVersion() >= 2 && extensions.match("GL_KHR_blend_equation_advanced_coherent")) {
                // GL_KHR_blend_equation_advanced is included in OpenGL ES/3.2
                features |= QOpenGLFunctions::BlendEquationAdvanced;
            }
        }
        return features;
    } else {
        // OpenGL
        features |= QOpenGLFunctions::TextureRGFormats;
        QSurfaceFormat format = QOpenGLContext::currentContext()->format();

        if (format.majorVersion() >= 3)
            features |= QOpenGLFunctions::Framebuffers | QOpenGLFunctions::MultipleRenderTargets;
        else if (extensions.match("GL_EXT_framebuffer_object") || extensions.match("GL_ARB_framebuffer_object"))
            features |= QOpenGLFunctions::Framebuffers | QOpenGLFunctions::MultipleRenderTargets;

        if (format.majorVersion() >= 2) {
            features |= QOpenGLFunctions::BlendColor |
                QOpenGLFunctions::BlendEquation |
                QOpenGLFunctions::BlendSubtract |
                QOpenGLFunctions::Multitexture |
                QOpenGLFunctions::CompressedTextures |
                QOpenGLFunctions::Multisample |
                QOpenGLFunctions::BlendFuncSeparate |
                QOpenGLFunctions::Buffers |
                QOpenGLFunctions::Shaders |
                QOpenGLFunctions::StencilSeparate |
                QOpenGLFunctions::BlendEquationSeparate |
                QOpenGLFunctions::NPOTTextures |
                QOpenGLFunctions::NPOTTextureRepeat;
        } else {
            // Recognize features by extension name.
            if (extensions.match("GL_ARB_multitexture"))
                features |= QOpenGLFunctions::Multitexture;
            if (extensions.match("GL_ARB_shader_objects"))
                features |= QOpenGLFunctions::Shaders;
            if (extensions.match("GL_EXT_blend_color"))
                features |= QOpenGLFunctions::BlendColor;
            if (extensions.match("GL_EXT_blend_equation_separate"))
                features |= QOpenGLFunctions::BlendEquationSeparate;
            if (extensions.match("GL_EXT_blend_subtract"))
                features |= QOpenGLFunctions::BlendSubtract;
            if (extensions.match("GL_EXT_blend_func_separate"))
                features |= QOpenGLFunctions::BlendFuncSeparate;
            if (extensions.match("GL_ARB_texture_compression"))
                features |= QOpenGLFunctions::CompressedTextures;
            if (extensions.match("GL_ARB_multisample"))
                features |= QOpenGLFunctions::Multisample;
            if (extensions.match("GL_ARB_texture_non_power_of_two"))
                features |= QOpenGLFunctions::NPOTTextures |
                    QOpenGLFunctions::NPOTTextureRepeat;
        }

        const std::pair<int, int> version = format.version();
        if (version < std::pair(3, 0)
            || (version == std::pair(3, 0) && format.testOption(QSurfaceFormat::DeprecatedFunctions))
            || (version == std::pair(3, 1) && extensions.match("GL_ARB_compatibility"))
            || (version >= std::pair(3, 2) && format.profile() == QSurfaceFormat::CompatibilityProfile)) {
            features |= QOpenGLFunctions::FixedFunctionPipeline;
        }
        return features;
    }
}